

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack5_16(uint32_t *in,uint32_t *out)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  auVar4 = vpbroadcastd_avx512vl();
  uVar1 = *(ulong *)(in + 1);
  auVar5 = vpbroadcastd_avx512vl();
  auVar2 = vpinsrd_avx(auVar5,*in,0);
  auVar6 = vpinsrd_avx(auVar4,*in >> 5,1);
  auVar3 = vpsrlvd_avx2(auVar4,_DAT_001a1d50);
  auVar6 = vpunpcklqdq_avx(auVar6,auVar3);
  auVar7._8_4_ = 0x1f;
  auVar7._0_8_ = 0x1f0000001f;
  auVar7._12_4_ = 0x1f;
  auVar6 = vpand_avx(auVar6,auVar7);
  *(undefined1 (*) [16])out = auVar6;
  auVar6 = vpsrlvd_avx2(auVar4,_DAT_001a1d60);
  auVar6 = vpand_avx(auVar6,auVar7);
  *(long *)(out + 4) = auVar6._0_8_;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar1;
  auVar3 = vpshufd_avx(auVar6,0x54);
  auVar6 = vpshufd_avx(auVar2,0x54);
  auVar4 = vpsrlvd_avx2(auVar6,_DAT_001a1d70);
  auVar6 = vpinsrd_avx(auVar7,(int)uVar1 * 4 & 0x1c,0);
  auVar2 = vpor_avx(auVar4,auVar6);
  auVar6 = vpand_avx(auVar4,auVar7);
  auVar6 = vpblendd_avx2(auVar6,auVar2,1);
  *(undefined1 (*) [16])(out + 6) = auVar6;
  auVar6 = vpsrlvd_avx2(auVar5,_DAT_001a1d80);
  auVar6 = vpand_avx(auVar6,auVar7);
  *(long *)(out + 10) = auVar6._0_8_;
  auVar3 = vpsrlvd_avx2(auVar3,_DAT_001a1d90);
  auVar6 = vpinsrd_avx(auVar7,((uint)(uVar1 >> 0x20) & 1) << 4,0);
  auVar2 = vpor_avx(auVar3,auVar6);
  auVar6 = vpand_avx(auVar3,auVar7);
  auVar6 = vpblendd_avx2(auVar6,auVar2,1);
  *(undefined1 (*) [16])(out + 0xc) = auVar6;
  return in + 3;
}

Assistant:

const uint32_t *__fastunpack5_16(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 5);
  out++;
  *out = ((*in) >> 5) % (1U << 5);
  out++;
  *out = ((*in) >> 10) % (1U << 5);
  out++;
  *out = ((*in) >> 15) % (1U << 5);
  out++;
  *out = ((*in) >> 20) % (1U << 5);
  out++;
  *out = ((*in) >> 25) % (1U << 5);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 3)) << (5 - 3);
  out++;
  *out = ((*in) >> 3) % (1U << 5);
  out++;
  *out = ((*in) >> 8) % (1U << 5);
  out++;
  *out = ((*in) >> 13) % (1U << 5);
  out++;
  *out = ((*in) >> 18) % (1U << 5);
  out++;
  *out = ((*in) >> 23) % (1U << 5);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 1)) << (5 - 1);
  out++;
  *out = ((*in) >> 1) % (1U << 5);
  out++;
  *out = ((*in) >> 6) % (1U << 5);
  out++;
  *out = ((*in) >> 11) % (1U << 5);
  out++;

  return in + 1;
}